

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

void splitStr(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *rez,char *str,char splitter)

{
  char *pcVar1;
  char *pcVar2;
  char *prevPos;
  long local_40;
  char *local_38;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(rez);
  pcVar2 = str;
  local_38 = str;
  for (pcVar1 = str; *pcVar1 != '\0'; pcVar1 = pcVar1 + 1) {
    if (*pcVar1 == splitter) {
      local_40 = (long)pcVar2 - (long)str;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&,long>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)rez,&local_38,
                 &local_40);
      str = pcVar1 + 1;
      local_38 = str;
    }
    pcVar2 = pcVar2 + 1;
  }
  if (str < pcVar1) {
    local_40 = (long)pcVar2 - (long)str;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*&,long>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)rez,&local_38,
               &local_40);
  }
  return;
}

Assistant:

void splitStr(vector<string>& rez, const char* str, const char splitter)
{
    rez.clear();
    const char* prevPos = str;
    const char* buf = str;
    for (; *buf; buf++)
    {
        if (*buf == splitter)
        {
            rez.emplace_back(prevPos, buf - prevPos);
            prevPos = buf + 1;
        }
    }
    if (buf > prevPos)
        rez.emplace_back(prevPos, buf - prevPos);
}